

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

int skipIfBlock(bool toEndc)

{
  LexerState *pLVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t uVar5;
  char *fmt;
  byte bVar6;
  
  pLVar1 = lexerState;
  lexerState->mode = LEXER_NORMAL;
  uVar3 = lexer_GetIFDepth();
  bVar6 = pLVar1->atLineStart;
  pLVar1->disableMacroArgs = true;
  pLVar1->disableInterpolation = true;
  do {
    if ((bVar6 & 1) == 0) goto LAB_0010e64f;
    while ((iVar4 = peek(), iVar4 == 0x20 || (iVar4 == 9))) {
      shiftChar();
    }
    bVar2 = startsIdentifier(iVar4);
    if (!bVar2) goto switchD_0010e5fc_default;
    shiftChar();
    iVar4 = readIdentifier((char)iVar4);
    switch(iVar4) {
    case 0x5d:
      lexer_IncIFDepth();
      break;
    case 0x5e:
      if (lexerState->ifStack->reachedElseBlock == true) {
        fmt = "Found ELIF after an ELSE block\n";
LAB_0010e6d5:
        fatalerror(fmt);
      }
      goto LAB_0010e634;
    case 0x5f:
      if (lexerState->ifStack->reachedElseBlock == true) {
        fmt = "Found ELSE after an ELSE block\n";
        goto LAB_0010e6d5;
      }
      lexerState->ifStack->reachedElseBlock = true;
LAB_0010e634:
      if (!toEndc) {
switchD_0010e5fc_caseD_60:
        uVar5 = lexer_GetIFDepth();
        if (uVar5 == uVar3) {
LAB_0010e6a4:
          pLVar1 = lexerState;
          pLVar1->disableMacroArgs = false;
          pLVar1->disableInterpolation = false;
          pLVar1->atLineStart = false;
          return iVar4;
        }
        if (iVar4 == 0x60) {
          lexer_DecIFDepth();
        }
      }
      break;
    case 0x60:
      goto switchD_0010e5fc_caseD_60;
    }
switchD_0010e5fc_default:
    bVar6 = 0;
LAB_0010e64f:
    do {
      iVar4 = nextChar();
      if ((iVar4 == 10) || (iVar4 == 0xd)) {
        bVar6 = 1;
      }
      else if (iVar4 == 0x5c) {
        iVar4 = nextChar();
      }
      else if (iVar4 == -1) {
        iVar4 = 0;
        goto LAB_0010e6a4;
      }
      if ((iVar4 == 0xd) || (iVar4 == 10)) {
        handleCRLF(iVar4);
        pLVar1 = lexerState;
        lexerState->lineNo = lexerState->lineNo + 1;
        pLVar1->colNo = 1;
      }
    } while ((bVar6 & 1) == 0);
  } while( true );
}

Assistant:

static int skipIfBlock(bool toEndc)
{
	lexer_SetMode(LEXER_NORMAL);
	uint32_t startingDepth = lexer_GetIFDepth();
	int token;
	bool atLineStart = lexerState->atLineStart;

	// Prevent expanding macro args and symbol interpolation in this state
	lexerState->disableMacroArgs = true;
	lexerState->disableInterpolation = true;

	for (;;) {
		if (atLineStart) {
			int c;

			for (;; shiftChar()) {
				c = peek();
				if (!isWhitespace(c))
					break;
			}

			if (startsIdentifier(c)) {
				shiftChar();
				token = readIdentifier(c);
				switch (token) {
				case T_POP_IF:
					lexer_IncIFDepth();
					break;

				case T_POP_ELIF:
					if (lexer_ReachedELSEBlock())
						fatalerror("Found ELIF after an ELSE block\n");
					goto maybeFinish;

				case T_POP_ELSE:
					if (lexer_ReachedELSEBlock())
						fatalerror("Found ELSE after an ELSE block\n");
					lexer_ReachELSEBlock();
					// fallthrough
				maybeFinish:
					if (toEndc) // Ignore ELIF and ELSE, go to ENDC
						break;
					// fallthrough
				case T_POP_ENDC:
					if (lexer_GetIFDepth() == startingDepth)
						goto finish;
					if (token == T_POP_ENDC)
						lexer_DecIFDepth();
				}
			}
			atLineStart = false;
		}

		// Read chars until EOL
		do {
			int c = nextChar();

			if (c == EOF) {
				token = T_EOF;
				goto finish;
			} else if (c == '\\') {
				// Unconditionally skip the next char, including line conts
				c = nextChar();
			} else if (c == '\r' || c == '\n') {
				atLineStart = true;
			}

			if (c == '\r' || c == '\n') {
				// Handle CRLF before nextLine() since shiftChar updates colNo
				handleCRLF(c);
				// Do this both on line continuations and plain EOLs
				nextLine();
			}
		} while (!atLineStart);
	}

finish:
	lexerState->disableMacroArgs = false;
	lexerState->disableInterpolation = false;
	lexerState->atLineStart = false;

	return token;
}